

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O2

kiss_fftnd_cfg kiss_fftnd_alloc(int *dims,int ndims,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  int *piVar1;
  kiss_fftnd_cfg pkVar2;
  kiss_fft_cfg pkVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  kiss_fft_cpx *mem_00;
  ulong uVar7;
  long lVar8;
  size_t sublen;
  kiss_fftnd_cfg local_38;
  
  uVar5 = (ulong)(uint)(~(ndims >> 0x1f) & ndims);
  lVar6 = 0x20;
  iVar4 = 1;
  local_38 = (kiss_fftnd_cfg)mem;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    sublen = 0;
    kiss_fft_alloc(dims[uVar7],inverse_fft,(void *)0x0,&sublen);
    iVar4 = iVar4 * dims[uVar7];
    lVar6 = lVar6 + sublen;
  }
  lVar8 = (long)ndims;
  __size = lVar8 * 0xc + lVar6 + (long)iVar4 * 8;
  if (lenmem == (size_t *)0x0) {
    pkVar2 = (kiss_fftnd_cfg)malloc(__size);
  }
  else {
    uVar7 = *lenmem;
    *lenmem = __size;
    pkVar2 = local_38;
    if (uVar7 < __size) {
      return (kiss_fftnd_cfg)0x0;
    }
  }
  if (pkVar2 == (kiss_fftnd_cfg)0x0) {
    return (kiss_fftnd_cfg)0x0;
  }
  pkVar2->dimprod = iVar4;
  piVar1 = &pkVar2[1].dimprod + lVar8 * 2;
  pkVar2->ndims = ndims;
  pkVar2->states = (kiss_fft_cfg *)(pkVar2 + 1);
  pkVar2->dims = piVar1;
  pkVar2->tmpbuf = (kiss_fft_cpx *)(piVar1 + lVar8);
  mem_00 = (kiss_fft_cpx *)(piVar1 + lVar8) + iVar4;
  local_38 = (kiss_fftnd_cfg)__size;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    iVar4 = dims[uVar7];
    pkVar2->dims[uVar7] = iVar4;
    kiss_fft_alloc(iVar4,inverse_fft,(void *)0x0,&sublen);
    pkVar3 = kiss_fft_alloc(pkVar2->dims[uVar7],inverse_fft,mem_00,&sublen);
    pkVar2->states[uVar7] = pkVar3;
    mem_00 = (kiss_fft_cpx *)((long)&mem_00->r + sublen);
  }
  if ((long)mem_00 - (long)pkVar2 != (long)(int)local_38) {
    fwrite("################################################################################\nInternal error! Memory allocation miscalculation\n################################################################################\n"
           ,0xd3,1,_stderr);
    return pkVar2;
  }
  return pkVar2;
}

Assistant:

kiss_fftnd_cfg kiss_fftnd_alloc(const int *dims,int ndims,int inverse_fft,void*mem,size_t*lenmem)
{
    kiss_fftnd_cfg st = NULL;
    int i;
    int dimprod=1;
    size_t memneeded = sizeof(struct kiss_fftnd_state);
    char * ptr;

    for (i=0;i<ndims;++i) {
        size_t sublen=0;
        kiss_fft_alloc (dims[i], inverse_fft, NULL, &sublen);
        memneeded += sublen;   /* st->states[i] */
        dimprod *= dims[i];
    }
    memneeded += sizeof(int) * ndims;/*  st->dims */
    memneeded += sizeof(void*) * ndims;/* st->states  */
    memneeded += sizeof(kiss_fft_cpx) * dimprod; /* st->tmpbuf */

    if (lenmem == NULL) {/* allocate for the caller*/
        st = (kiss_fftnd_cfg) malloc (memneeded);
    } else { /* initialize supplied buffer if big enough */
        if (*lenmem >= memneeded)
            st = (kiss_fftnd_cfg) mem;
        *lenmem = memneeded; /*tell caller how big struct is (or would be) */
    }
    if (!st)
        return NULL; /*malloc failed or buffer too small */

    st->dimprod = dimprod;
    st->ndims = ndims;
    ptr=(char*)(st+1);

    st->states = (kiss_fft_cfg *)ptr;
    ptr += sizeof(void*) * ndims;

    st->dims = (int*)ptr;
    ptr += sizeof(int) * ndims;

    st->tmpbuf = (kiss_fft_cpx*)ptr;
    ptr += sizeof(kiss_fft_cpx) * dimprod;

    for (i=0;i<ndims;++i) {
        size_t len;
        st->dims[i] = dims[i];
        kiss_fft_alloc (st->dims[i], inverse_fft, NULL, &len);
        st->states[i] = kiss_fft_alloc (st->dims[i], inverse_fft, ptr,&len);
        ptr += len;
    }
    /*
Hi there!

If you're looking at this particular code, it probably means you've got a brain-dead bounds checker 
that thinks the above code overwrites the end of the array.

It doesn't.

-- Mark 

P.S.
The below code might give you some warm fuzzies and help convince you.
       */
    if ( ptr - (char*)st != (int)memneeded ) {
        fprintf(stderr,
                "################################################################################\n"
                "Internal error! Memory allocation miscalculation\n"
                "################################################################################\n"
               );
    }
    return st;
}